

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O0

Vec_Int_t *
findNewMonotone(Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,
               monotoneVectorsStruct *monotoneVectorArg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Aig_Man_t *p;
  int hintSingalBeginningMarkerLocal;
  int pendingSignalIndexLocal;
  Vec_Int_t *vMonotoneIndex;
  Abc_Cex_t *pCex;
  Pdr_Par_t *pPars;
  Pdr_Par_t Pars;
  int RetValue;
  int i;
  int oldPoNum;
  int poMarker;
  Aig_Obj_t *pObjTargetPo;
  Aig_Man_t *pAigNew;
  monotoneVectorsStruct *monotoneVectorArg_local;
  aigPoIndices *aigPoIndicesArg_local;
  Aig_Man_t *pAig_local;
  
  iVar7 = aigPoIndicesArg->attrPendingSignalIndex;
  iVar1 = aigPoIndicesArg->attrHintSingalBeginningMarker;
  pAigNew = (Aig_Man_t *)monotoneVectorArg;
  monotoneVectorArg_local = (monotoneVectorsStruct *)aigPoIndicesArg;
  aigPoIndicesArg_local = (aigPoIndices *)pAig;
  pObjTargetPo = (Aig_Obj_t *)createMonotoneTester(pAig,aigPoIndicesArg,monotoneVectorArg,&i);
  iVar3 = Aig_ManCoNum((Aig_Man_t *)aigPoIndicesArg_local);
  iVar4 = Aig_ManRegNum((Aig_Man_t *)aigPoIndicesArg_local);
  p = (Aig_Man_t *)Vec_IntAlloc(0);
  uVar5 = Saig_ManPoNum((Aig_Man_t *)pObjTargetPo);
  printf("\nSaig_ManPoNum(pAigNew) = %d, poMarker = %d\n",(ulong)uVar5,(ulong)(uint)i);
  for (Pars.vOutMap._4_4_ = i; iVar2 = Pars.vOutMap._4_4_,
      iVar6 = Saig_ManPoNum((Aig_Man_t *)pObjTargetPo), iVar2 < iVar6;
      Pars.vOutMap._4_4_ = Pars.vOutMap._4_4_ + 1) {
    _oldPoNum = Aig_ManCo((Aig_Man_t *)pObjTargetPo,Pars.vOutMap._4_4_);
    Aig_ObjChild0Flip(_oldPoNum);
    Pdr_ManSetDefaultParams((Pdr_Par_t *)&pPars);
    Pars.fReuseProofOblig = 0;
    Pars.vOutMap._0_4_ = Pdr_ManSolve((Aig_Man_t *)pObjTargetPo,(Pdr_Par_t *)&pPars);
    if ((int)Pars.vOutMap == 1) {
      printf("\ni = %d, RetValue = %d : %s (Frame %d)\n",
             (ulong)(uint)((Pars.vOutMap._4_4_ - (iVar3 - iVar4)) + iVar1),1,"Property Proved",
             0xffffffff);
      Vec_IntPush((Vec_Int_t *)p,(Pars.vOutMap._4_4_ - (iVar7 + 1)) + iVar1);
    }
    Aig_ObjChild0Flip(_oldPoNum);
  }
  iVar7 = Vec_IntSize((Vec_Int_t *)p);
  pAig_local = p;
  if (iVar7 < 1) {
    pAig_local = (Aig_Man_t *)0x0;
  }
  return (Vec_Int_t *)pAig_local;
}

Assistant:

Vec_Int_t *findNewMonotone( Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, struct monotoneVectorsStruct *monotoneVectorArg )
{
	Aig_Man_t *pAigNew;
	Aig_Obj_t *pObjTargetPo;
	int poMarker, oldPoNum;
	int i, RetValue;
	Pdr_Par_t Pars, * pPars = &Pars;
	Abc_Cex_t * pCex = NULL;
	Vec_Int_t *vMonotoneIndex;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;
	int hintSingalBeginningMarkerLocal = aigPoIndicesArg->attrHintSingalBeginningMarker;
	//int hintSingalEndMarkerLocal = aigPoIndicesArg->attrHintSingalEndMarker;

	//Vec_Int_t *vKnownMonotoneLocal = monotoneVectorArg->attrKnownMonotone;
	//Vec_Int_t *vCandMonotoneLocal = monotoneVectorArg->attrCandMonotone;
	//Vec_Int_t *vHintMonotoneLocal = monotoneVectorArg->attrHintMonotone;

	pAigNew = createMonotoneTester(pAig, aigPoIndicesArg, monotoneVectorArg, &poMarker );
	oldPoNum = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);

	vMonotoneIndex = Vec_IntAlloc(0);
	printf("\nSaig_ManPoNum(pAigNew) = %d, poMarker = %d\n", Saig_ManPoNum(pAigNew), poMarker);
	for( i=poMarker; i<Saig_ManPoNum(pAigNew); i++ )
	{
		pObjTargetPo = Aig_ManCo( pAigNew, i );
		Aig_ObjChild0Flip( pObjTargetPo );

		Pdr_ManSetDefaultParams( pPars );
		pCex = NULL;
		pPars->fVerbose = 0;
		//pPars->iOutput = i;
		//RetValue = Pdr_ManSolve( pAigNew, pPars, &pCex );	
		RetValue = Pdr_ManSolve( pAigNew, pPars );	
		if( RetValue == 1 )
		{
			printf("\ni = %d, RetValue = %d : %s (Frame %d)\n", i - oldPoNum + hintSingalBeginningMarkerLocal, RetValue, "Property Proved", pCex? (pCex)->iFrame : -1 );
			Vec_IntPush( vMonotoneIndex, i - (pendingSignalIndexLocal + 1) + hintSingalBeginningMarkerLocal);
		}
		Aig_ObjChild0Flip( pObjTargetPo );
	}
	
	if( Vec_IntSize( vMonotoneIndex ) > 0 )
		return vMonotoneIndex;
	else
		return NULL;
}